

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * closeDirPath(string *__return_storage_ptr__,string *src,char delimiter)

{
  size_type sVar1;
  pointer pcVar2;
  
  if (delimiter == ' ') {
    getDirSeparator();
  }
  sVar1 = src->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (src->_M_dataplus)._M_p;
  }
  else {
    pcVar2 = (src->_M_dataplus)._M_p;
    if ((pcVar2[sVar1 - 1] != '\\') && (pcVar2[sVar1 - 1] != '/')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string closeDirPath(const string& src, char delimiter)
{
    if (delimiter == ' ')
        delimiter = getDirSeparator();
    if (src.length() == 0)
        return src;
    if (src[src.length() - 1] == '/' || src[src.length() - 1] == '\\')
        return src;
    return src + delimiter;
}